

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FeatureSetDefaults * __thiscall
google::protobuf::DescriptorPool::GetFeatureSetDefaults(DescriptorPool *this)

{
  int iVar1;
  FeatureSetDefaults *pFVar2;
  MessageLite *in_RCX;
  string_view from;
  
  pFVar2 = (this->feature_set_defaults_spec_)._M_t.
           super___uniq_ptr_impl<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::FeatureSetDefaults_*,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
           .super__Head_base<0UL,_google::protobuf::FeatureSetDefaults_*,_false>._M_head_impl;
  if (((pFVar2 == (FeatureSetDefaults *)0x0) &&
      (pFVar2 = GetFeatureSetDefaults::cpp_default_spec,
      GetFeatureSetDefaults()::cpp_default_spec == '\0')) &&
     (iVar1 = __cxa_guard_acquire(&GetFeatureSetDefaults()::cpp_default_spec),
     pFVar2 = GetFeatureSetDefaults::cpp_default_spec, iVar1 != 0)) {
    pFVar2 = (FeatureSetDefaults *)operator_new(0x38);
    FeatureSetDefaults::FeatureSetDefaults(pFVar2);
    from._M_str = (char *)pFVar2;
    from._M_len = (size_t)anon_var_dwarf_155861;
    internal::ParseNoReflection((internal *)0x9a,from,in_RCX);
    GetFeatureSetDefaults::cpp_default_spec =
         internal::OnShutdownDelete<google::protobuf::FeatureSetDefaults>(pFVar2);
    __cxa_guard_release(&GetFeatureSetDefaults()::cpp_default_spec);
    pFVar2 = GetFeatureSetDefaults::cpp_default_spec;
  }
  return pFVar2;
}

Assistant:

void Fold(std::initializer_list<ExpressionEater>) {}